

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  connectdata *pcVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  time_t tVar4;
  long *plVar5;
  Curl_tree *pCVar6;
  int iVar7;
  undefined7 in_register_00000031;
  Curl_easy *pCVar8;
  undefined8 *puVar9;
  bool bVar10;
  curltime cVar11;
  curltime now;
  curltime i;
  curltime now_00;
  Curl_tree *t;
  sigpipe_ignore pipe_st;
  Curl_tree *local_e0;
  int *local_d8;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar11 = Curl_now();
  tVar4 = cVar11.tv_sec;
  if ((int)CONCAT71(in_register_00000031,checkall) == 0) {
    iVar7 = cVar11.tv_usec;
    local_d8 = running_handles;
    if (s == -1) {
      (multi->timer_lastcall).tv_sec = 0;
      *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
      pCVar8 = (Curl_easy *)0x0;
      CVar3 = CURLM_OK;
    }
    else {
      local_d0[0]._0_4_ = s;
      plVar5 = (long *)Curl_hash_pick(&multi->sockhash,local_d0,4);
      if (plVar5 == (long *)0x0) {
        pCVar8 = (Curl_easy *)0x0;
        bVar10 = true;
        CVar3 = CURLM_OK;
      }
      else {
        puVar9 = (undefined8 *)*plVar5;
        bVar10 = puVar9 == (undefined8 *)0x0;
        if (bVar10) {
          CVar2 = CURLM_OK;
LAB_004ab8bb:
          cVar11 = Curl_now();
          tVar4 = cVar11.tv_sec;
          iVar7 = cVar11.tv_usec;
          pCVar8 = (Curl_easy *)0x0;
          CVar3 = CVar2;
        }
        else {
          running_handles = (int *)&DAT_00000004;
          CVar2 = CURLM_OK;
          pCVar8 = (Curl_easy *)*puVar9;
          while (CVar3 = CVar2, pCVar8->magic == 0xc0dedbad) {
            pcVar1 = pCVar8->conn;
            if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
              pcVar1->cselect_bits = ev_bitmask;
            }
            sigpipe_ignore(pCVar8,(sigpipe_ignore *)local_d0);
            now._12_4_ = 0;
            now.tv_sec = SUB128(cVar11._0_12_,0);
            now.tv_usec = SUB124(cVar11._0_12_,8);
            CVar2 = multi_runsingle(multi,now,pCVar8);
            if (local_38 == '\0') {
              sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
            }
            pcVar1 = pCVar8->conn;
            if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
              pcVar1->cselect_bits = 0;
            }
            if (CVar2 < CURLM_BAD_HANDLE) {
              CVar3 = singlesocket(multi,pCVar8);
              CVar2 = CURLM_OK;
              if (CVar3 != CURLM_OK) {
                running_handles = (int *)(ulong)(uint)CVar3;
                break;
              }
            }
            puVar9 = (undefined8 *)puVar9[2];
            bVar10 = puVar9 == (undefined8 *)0x0;
            if (bVar10) goto LAB_004ab8bb;
            pCVar8 = (Curl_easy *)*puVar9;
          }
        }
      }
      if (!bVar10) {
        return (CURLMcode)running_handles;
      }
    }
    do {
      if (pCVar8 != (Curl_easy *)0x0) {
        sigpipe_ignore(pCVar8,(sigpipe_ignore *)local_d0);
        cVar11.tv_usec = iVar7;
        cVar11.tv_sec = tVar4;
        cVar11._12_4_ = 0;
        CVar3 = multi_runsingle(multi,cVar11,pCVar8);
        if (local_38 == '\0') {
          sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
        }
        bVar10 = true;
        if (CVar3 < CURLM_BAD_HANDLE) {
          CVar2 = singlesocket(multi,pCVar8);
          CVar3 = CURLM_OK;
          if (CVar2 != CURLM_OK) {
            bVar10 = false;
            running_handles = (int *)(ulong)(uint)CVar2;
            CVar3 = CVar2;
          }
        }
        if (!bVar10) {
          return (CURLMcode)running_handles;
        }
      }
      i.tv_usec = iVar7;
      i.tv_sec = tVar4;
      i._12_4_ = 0;
      pCVar6 = Curl_splaygetbest(i,multi->timetree,&local_e0);
      multi->timetree = pCVar6;
      if (local_e0 != (Curl_tree *)0x0) {
        pCVar8 = (Curl_easy *)local_e0->payload;
        now_00.tv_usec = iVar7;
        now_00.tv_sec = tVar4;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,pCVar8);
      }
    } while (local_e0 != (Curl_tree *)0x0);
    *local_d8 = multi->num_alive;
  }
  else {
    CVar2 = curl_multi_perform(multi,running_handles);
    CVar3 = CURLM_BAD_HANDLE;
    if ((CVar2 != CURLM_BAD_HANDLE) &&
       (pCVar8 = multi->easyp, CVar3 = CVar2, CVar2 == CURLM_OK && pCVar8 != (Curl_easy *)0x0)) {
      do {
        CVar3 = singlesocket(multi,pCVar8);
        if (CVar3 != CURLM_OK) {
          return CVar3;
        }
        pCVar8 = pCVar8->next;
        CVar3 = CURLM_OK;
      } while (pCVar8 != (Curl_easy *)0x0);
    }
  }
  return CVar3;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct curl_llist *list = &entry->list;
      struct curl_llist_element *e;
      SIGPIPE_VARIABLE(pipe_st);

      /* the socket can be shared by many transfers, iterate */
      for(e = list->head; e; e = e->next) {
        data = (struct Curl_easy *)e->ptr;

        if(data->magic != CURLEASY_MAGIC_NUMBER)
          /* bad bad bad bad bad bad bad */
          return CURLM_INTERNAL_ERROR;

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->conn->cselect_bits = ev_bitmask;

        sigpipe_ignore(data, &pipe_st);
        result = multi_runsingle(multi, now, data);
        sigpipe_restore(&pipe_st);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* clear the bitmask only if not locked */
          data->conn->cselect_bits = 0;

        if(CURLM_OK >= result) {
          /* get the socket(s) and check if the state has been changed since
             last */
          result = singlesocket(multi, data);
          if(result)
            return result;
        }
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}